

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_7.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonschema::draft7::
schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::init(schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_false,_true>,_bool>
  pVar2;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  unordered_map<_4822c21c_> *in_stack_fffffffffffffd20;
  evaluation_options local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
  local_50;
  undefined1 local_48;
  schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
  local_38;
  undefined1 local_30;
  schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
  local_20;
  undefined1 local_18;
  schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_10;
  schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_8;
  
  local_10 = this;
  local_8 = this;
  pVar2 = std::
          unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
          ::
          emplace<char_const(&)[5],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_1_>
                    (in_stack_fffffffffffffd20,
                     (char (*) [5])CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                     (anon_class_8_1_8991fb9c *)this);
  local_20._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
       ._M_cur;
  local_18 = pVar2.second;
  local_28 = this;
  pVar2 = std::
          unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
          ::
          emplace<char_const(&)[16],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_2_>
                    (in_stack_fffffffffffffd20,
                     (char (*) [16])CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                     (anon_class_8_1_8991fb9c *)this);
  local_38._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
       ._M_cur;
  local_30 = pVar2.second;
  local_40 = this;
  pVar2 = std::
          unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
          ::
          emplace<char_const(&)[17],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_3_>
                    (in_stack_fffffffffffffd20,
                     (char (*) [17])CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                     (anon_class_8_1_8991fb9c *)this);
  local_50._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
       ._M_cur;
  local_48 = pVar2.second;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::options(in_stack_fffffffffffffd08);
  bVar1 = evaluation_options::require_format_validation(&local_a0);
  evaluation_options::~evaluation_options((evaluation_options *)this);
  if ((bVar1 & 1) != 0) {
    std::
    unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
    ::
    emplace<char_const(&)[7],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_4_>
              (in_stack_fffffffffffffd20,(char (*) [7])CONCAT17(bVar1,in_stack_fffffffffffffd18),
               (anon_class_8_1_8991fb9c *)this);
  }
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[8],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_5_>
            (in_stack_fffffffffffffd20,(char (*) [8])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_6_>
            (in_stack_fffffffffffffd20,(char (*) [9])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_7_>
            (in_stack_fffffffffffffd20,(char (*) [9])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[14],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_8_>
            (in_stack_fffffffffffffd20,(char (*) [14])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[14],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_9_>
            (in_stack_fffffffffffffd20,(char (*) [14])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_10_>
            (in_stack_fffffffffffffd20,(char (*) [9])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[12],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_11_>
            (in_stack_fffffffffffffd20,(char (*) [12])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[10],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_12_>
            (in_stack_fffffffffffffd20,(char (*) [10])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[10],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_13_>
            (in_stack_fffffffffffffd20,(char (*) [10])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[4],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_14_>
            (in_stack_fffffffffffffd20,(char (*) [4])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[8],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_15_>
            (in_stack_fffffffffffffd20,(char (*) [8])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[17],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_16_>
            (in_stack_fffffffffffffd20,(char (*) [17])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[8],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_17_>
            (in_stack_fffffffffffffd20,(char (*) [8])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[17],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_18_>
            (in_stack_fffffffffffffd20,(char (*) [17])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[11],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_19_>
            (in_stack_fffffffffffffd20,(char (*) [11])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_20_>
            (in_stack_fffffffffffffd20,(char (*) [6])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[5],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_21_>
            (in_stack_fffffffffffffd20,(char (*) [5])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_22_>
            (in_stack_fffffffffffffd20,(char (*) [6])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_23_>
            (in_stack_fffffffffffffd20,(char (*) [6])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[6],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_24_>
            (in_stack_fffffffffffffd20,(char (*) [6])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[13],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_25_>
            (in_stack_fffffffffffffd20,(char (*) [13])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  std::
  unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
  ::
  emplace<char_const(&)[14],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_26_>
            (in_stack_fffffffffffffd20,(char (*) [14])CONCAT17(bVar1,in_stack_fffffffffffffd18),
             (anon_class_8_1_8991fb9c *)this);
  pVar2 = std::
          unordered_map<std::__cxx11::string,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)>>>>
          ::
          emplace<char_const(&)[9],jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::init()::_lambda(jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,std::unordered_map<std::__cxx11::string,jsoncons::jsonschema::uri_wrapper,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,jsoncons::jsonschema::uri_wrapper>>>&)_27_>
                    (in_stack_fffffffffffffd20,
                     (char (*) [9])CONCAT17(bVar1,in_stack_fffffffffffffd18),
                     (anon_class_8_1_8991fb9c *)this);
  return (int)pVar2.first.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_(const_jsoncons::jsonschema::compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>_>_&)>_>,_true>
              ._M_cur;
}

Assistant:

void init()
        {
            keyword_factory_map_.emplace("type", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_type_validator(context, sch, parent);});
            keyword_factory_map_.emplace("contentEncoding", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&)
            {
                return factory_.make_content_encoding_validator(context, sch, parent);}
            );
            keyword_factory_map_.emplace("contentMediaType", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_content_media_type_validator(context, sch, parent);});
            if (this->options().require_format_validation())
            {
                keyword_factory_map_.emplace("format", 
                    [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_format_validator(context, sch, parent);});
            }
#if defined(JSONCONS_HAS_STD_REGEX)
            keyword_factory_map_.emplace("pattern", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_pattern_validator(context, sch, parent);});
#endif
            keyword_factory_map_.emplace("maxItems", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_max_items_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minItems", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_min_items_validator(context, sch, parent);});
            keyword_factory_map_.emplace("maxProperties", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_max_properties_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minProperties", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_min_properties_validator(context, sch, parent);});
            keyword_factory_map_.emplace("contains", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict)
                        {return factory_.make_contains_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("uniqueItems", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_unique_items_validator(context, sch, parent);});
            keyword_factory_map_.emplace("maxLength", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_max_length_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minLength", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_min_length_validator(context, sch, parent);});
            keyword_factory_map_.emplace("not", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_not_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("maximum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_maximum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("exclusiveMaximum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_exclusive_maximum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("minimum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_minimum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("exclusiveMinimum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_exclusive_minimum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("multipleOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_multiple_of_validator(context, sch, parent);});
            keyword_factory_map_.emplace("const", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_const_validator(context, sch, parent);});
            keyword_factory_map_.emplace("enum", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_enum_validator(context, sch, parent);});
            keyword_factory_map_.emplace("allOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_all_of_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("anyOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_any_of_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("oneOf", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_one_of_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("dependencies", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_dependencies_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("propertyNames", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict){return factory_.make_property_names_validator(context, sch, parent, anchor_dict);});
            keyword_factory_map_.emplace("required", 
                [&](const compilation_context<Json>& context, const Json& sch, const Json& parent, anchor_uri_map_type&){return factory_.make_required_validator(context, sch, parent);});
        }